

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O0

int Nwk_ManVerifyTopoOrder(Nwk_Man_t *pNtk)

{
  int iVar1;
  uint iBox_00;
  int iVar2;
  int iVar3;
  Nwk_Obj_t *p;
  bool bVar4;
  int nTerms;
  int iTerm1;
  int iBox;
  int k;
  int i;
  Nwk_Obj_t *pNext;
  Nwk_Obj_t *pObj;
  Nwk_Man_t *pNtk_local;
  
  Nwk_ManIncrementTravId(pNtk);
  iBox = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= iBox) {
      return 1;
    }
    p = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,iBox);
    if (p != (Nwk_Obj_t *)0x0) {
      iVar1 = Nwk_ObjIsNode(p);
      if ((iVar1 == 0) && (iVar1 = Nwk_ObjIsCo(p), iVar1 == 0)) {
        iVar1 = Nwk_ObjIsCi(p);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkDfs.c"
                        ,0x55,"int Nwk_ManVerifyTopoOrder(Nwk_Man_t *)");
        }
        if ((pNtk->pManTime != (Tim_Man_t *)0x0) &&
           (iBox_00 = Tim_ManBoxForCi(pNtk->pManTime,*(uint *)&p->field_0x20 >> 7),
           -1 < (int)iBox_00)) {
          iVar1 = Tim_ManBoxInputFirst(pNtk->pManTime,iBox_00);
          iVar2 = Tim_ManBoxInputNum(pNtk->pManTime,iBox_00);
          for (iTerm1 = 0; iTerm1 < iVar2; iTerm1 = iTerm1 + 1) {
            _k = Nwk_ManCo(pNtk,iVar1 + iTerm1);
            iVar3 = Nwk_ObjIsTravIdCurrent(_k);
            if (iVar3 == 0) {
              printf("Box %d has input %d that is not in a topological order.\n",(ulong)iBox_00,
                     (ulong)(uint)_k->Id);
              return 0;
            }
          }
        }
      }
      else {
        iTerm1 = 0;
        while( true ) {
          bVar4 = false;
          if (iTerm1 < p->nFanins) {
            _k = p->pFanio[iTerm1];
            bVar4 = _k != (Nwk_Obj_t *)0x0;
          }
          if (!bVar4) break;
          iVar1 = Nwk_ObjIsTravIdCurrent(_k);
          if (iVar1 == 0) {
            printf("Node %d has fanin %d that is not in a topological order.\n",(ulong)(uint)p->Id,
                   (ulong)(uint)_k->Id);
            return 0;
          }
          iTerm1 = iTerm1 + 1;
        }
      }
      Nwk_ObjSetTravIdCurrent(p);
    }
    iBox = iBox + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Verifies that the objects are in a topo order.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Nwk_ManVerifyTopoOrder( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj, * pNext;
    int i, k, iBox, iTerm1, nTerms;
    Nwk_ManIncrementTravId( pNtk );
    Nwk_ManForEachObj( pNtk, pObj, i )
    {
        if ( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCo(pObj) )
        {
            Nwk_ObjForEachFanin( pObj, pNext, k )
            {
                if ( !Nwk_ObjIsTravIdCurrent(pNext) )
                {
                    printf( "Node %d has fanin %d that is not in a topological order.\n", pObj->Id, pNext->Id );
                    return 0;
                }
            }
        }
        else if ( Nwk_ObjIsCi(pObj) )
        {
            if ( pNtk->pManTime )
            {
                iBox = Tim_ManBoxForCi( pNtk->pManTime, pObj->PioId );
                if ( iBox >= 0 ) // this is not a true PI
                {
                    iTerm1 = Tim_ManBoxInputFirst( pNtk->pManTime, iBox );
                    nTerms = Tim_ManBoxInputNum( pNtk->pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Nwk_ManCo( pNtk, iTerm1 + k );
                        if ( !Nwk_ObjIsTravIdCurrent(pNext) )
                        {
                            printf( "Box %d has input %d that is not in a topological order.\n", iBox, pNext->Id );
                            return 0;
                        }
                    }
                }
            }
        }
        else
            assert( 0 );
        Nwk_ObjSetTravIdCurrent( pObj );
    }
    return 1;
}